

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  group_type_pointer pgVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  byte bVar8;
  char *pcVar9;
  size_t sVar10;
  group_type_pointer pgVar11;
  uint64_t uVar12;
  size_t sVar13;
  uint uVar14;
  group_type_pointer pgVar15;
  ulong uVar16;
  PortInfo *pPVar17;
  PortInfo *pPVar18;
  long lVar19;
  value_type_pointer sv;
  value_type_pointer ppVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  bVar21 = 0;
  ppVar20 = (this->arrays).elements_;
  if (ppVar20 != (value_type_pointer)0x0) {
    sVar13 = (this->arrays).groups_size_mask;
    pgVar15 = (this->arrays).groups_;
    pgVar1 = pgVar15 + sVar13;
    pgVar11 = pgVar15 + sVar13 + 1;
    for (; pgVar15 != pgVar11; pgVar15 = pgVar15 + 1) {
      auVar22[0] = -(pgVar15->m[0].n == '\0');
      auVar22[1] = -(pgVar15->m[1].n == '\0');
      auVar22[2] = -(pgVar15->m[2].n == '\0');
      auVar22[3] = -(pgVar15->m[3].n == '\0');
      auVar22[4] = -(pgVar15->m[4].n == '\0');
      auVar22[5] = -(pgVar15->m[5].n == '\0');
      auVar22[6] = -(pgVar15->m[6].n == '\0');
      auVar22[7] = -(pgVar15->m[7].n == '\0');
      auVar22[8] = -(pgVar15->m[8].n == '\0');
      auVar22[9] = -(pgVar15->m[9].n == '\0');
      auVar22[10] = -(pgVar15->m[10].n == '\0');
      auVar22[0xb] = -(pgVar15->m[0xb].n == '\0');
      auVar22[0xc] = -(pgVar15->m[0xc].n == '\0');
      auVar22[0xd] = -(pgVar15->m[0xd].n == '\0');
      auVar22[0xe] = -(pgVar15->m[0xe].n == '\0');
      auVar22[0xf] = -(pgVar15->m[0xf].n == '\0');
      for (uVar14 = ((uint)(pgVar1 != pgVar15) << 0xe | 0x3fff) &
                    ~(uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(auVar22[0xf] >> 7) << 0xf); uVar14 != 0;
          uVar14 = uVar14 - 1 & uVar14) {
        uVar6 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        sv = ppVar20 + uVar6;
        uVar12 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            this,&sv->first);
        uVar16 = uVar12 >> ((byte)new_arrays_->groups_size_index & 0x3f);
        pgVar4 = new_arrays_->groups_;
        uVar5 = new_arrays_->groups_size_mask;
        lVar19 = 1;
        while( true ) {
          pgVar2 = pgVar4 + uVar16;
          bVar8 = pgVar2->m[0xf].n;
          auVar23[0] = -(pgVar2->m[0].n == '\0');
          auVar23[1] = -(pgVar2->m[1].n == '\0');
          auVar23[2] = -(pgVar2->m[2].n == '\0');
          auVar23[3] = -(pgVar2->m[3].n == '\0');
          auVar23[4] = -(pgVar2->m[4].n == '\0');
          auVar23[5] = -(pgVar2->m[5].n == '\0');
          auVar23[6] = -(pgVar2->m[6].n == '\0');
          auVar23[7] = -(pgVar2->m[7].n == '\0');
          auVar23[8] = -(pgVar2->m[8].n == '\0');
          auVar23[9] = -(pgVar2->m[9].n == '\0');
          auVar23[10] = -(pgVar2->m[10].n == '\0');
          auVar23[0xb] = -(pgVar2->m[0xb].n == '\0');
          auVar23[0xc] = -(pgVar2->m[0xc].n == '\0');
          auVar23[0xd] = -(pgVar2->m[0xd].n == '\0');
          auVar23[0xe] = -(pgVar2->m[0xe].n == '\0');
          auVar23[0xf] = -(bVar8 == 0);
          uVar7 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe;
          if (uVar7 != 0) break;
          pgVar4[uVar16].m[0xf].n = bVar8 | '\x01' << ((byte)uVar12 & 7);
          uVar16 = uVar16 + lVar19 & uVar5;
          lVar19 = lVar19 + 1;
        }
        uVar6 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        pcVar9 = (sv->first)._M_str;
        ppVar3 = new_arrays_->elements_ + uVar16 * 0xf + (ulong)uVar6;
        (ppVar3->first)._M_len = (sv->first)._M_len;
        (ppVar3->first)._M_str = pcVar9;
        pPVar17 = &sv->second;
        pPVar18 = &ppVar3->second;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pPVar18->syntax).ptr = (pPVar17->syntax).ptr;
          pPVar17 = (PortInfo *)((long)pPVar17 + (ulong)bVar21 * -0x10 + 8);
          pPVar18 = (PortInfo *)((long)pPVar18 + (ulong)bVar21 * -0x10 + 8);
        }
        pgVar4[uVar16].m[uVar6].n =
             *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word + (uVar12 & 0xff));
      }
      ppVar20 = ppVar20 + 0xf;
    }
  }
  delete_arrays(this,&this->arrays);
  sVar13 = new_arrays_->groups_size_index;
  sVar10 = new_arrays_->groups_size_mask;
  ppVar20 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar20;
  (this->arrays).groups_size_index = sVar13;
  (this->arrays).groups_size_mask = sVar10;
  sVar13 = initial_max_load(this);
  (this->size_ctrl).ml = sVar13;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }